

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

bool __thiscall Func::IsAggressiveIntTypeSpecDisabled(Func *this)

{
  bool bVar1;
  JITTimeFunctionBody *pJVar2;
  JITTimeProfileInfo *this_00;
  
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar2);
  if (bVar1) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar2);
    bVar1 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
    bVar1 = JITTimeProfileInfo::IsAggressiveIntTypeSpecDisabled(this_00,bVar1);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = JITOutput::IsAggressiveIntTypeSpecDisabled(&this->m_output);
  return bVar1;
}

Assistant:

bool
Func::IsAggressiveIntTypeSpecDisabled() const
{
    return (HasProfileInfo() && GetReadOnlyProfileInfo()->IsAggressiveIntTypeSpecDisabled(IsLoopBody())) || m_output.IsAggressiveIntTypeSpecDisabled();
}